

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.c
# Opt level: O2

size_t decay_npurge_after_interval(decay_t *decay,size_t interval)

{
  ulong uVar1;
  uint64_t *puVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  
  lVar3 = 0;
  puVar2 = h_steps;
  uVar1 = 0;
  sVar5 = interval;
  while (bVar6 = sVar5 != 0, sVar5 = sVar5 - 1, uVar4 = interval, bVar6) {
    uVar1 = uVar1 + *(long *)((long)h_steps + lVar3) * *(long *)((long)decay->backlog + lVar3);
    lVar3 = lVar3 + 8;
  }
  for (; uVar4 < 200; uVar4 = uVar4 + 1) {
    uVar1 = uVar1 + (puVar2[interval] - *puVar2) * decay->backlog[uVar4];
    puVar2 = puVar2 + 1;
  }
  return uVar1 >> 0x18;
}

Assistant:

static inline size_t
decay_npurge_after_interval(decay_t *decay, size_t interval) {
	size_t i;
	uint64_t sum = 0;
	for (i = 0; i < interval; i++) {
		sum += decay->backlog[i] * h_steps[i];
	}
	for (; i < SMOOTHSTEP_NSTEPS; i++) {
		sum += decay->backlog[i] *
		    (h_steps[i] - h_steps[i - interval]);
	}

	return (size_t)(sum >> SMOOTHSTEP_BFP);
}